

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

string * __thiscall
LTFlightData::FDDynamicData::GetSquawk_abi_cxx11_
          (string *__return_storage_ptr__,FDDynamicData *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1c;
  allocator<char> local_1b;
  char s [10];
  
  if ((this->radar).code - 10000U < 0xffffffffffffd8f1) {
    __s = "-";
    __a = &local_1b;
  }
  else {
    __s = s;
    snprintf(__s,10,"%04ld");
    __a = &local_1c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string LTFlightData::FDDynamicData::GetSquawk() const
{
    if (radar.code <= 0 || radar.code > 9999)
        return "-";
    else
    {
        char s[10];
        snprintf(s, sizeof(s), "%04ld", radar.code);
        return std::string(s);
    }
}